

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O3

bool duckdb::ContainsSink(PhysicalOperator *op)

{
  pointer prVar1;
  pointer prVar2;
  bool bVar3;
  int iVar4;
  pointer prVar5;
  
  iVar4 = (*op->_vptr_PhysicalOperator[0x21])();
  bVar3 = true;
  if ((char)iVar4 == '\0') {
    prVar1 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar2 = (op->children).
             super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (prVar1 == prVar2) {
      bVar3 = false;
    }
    else {
      do {
        prVar5 = prVar1 + 1;
        bVar3 = ContainsSink(prVar1->_M_data);
        if (bVar3) {
          return bVar3;
        }
        prVar1 = prVar5;
      } while (prVar5 != prVar2);
    }
  }
  return bVar3;
}

Assistant:

static bool ContainsSink(PhysicalOperator &op) {
	if (op.IsSink()) {
		return true;
	}
	for (auto &child : op.children) {
		if (ContainsSink(child)) {
			return true;
		}
	}
	return false;
}